

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O1

Context * Rml::GetContext(String *name)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  size_t sVar4;
  Context *pCVar5;
  long lVar6;
  
  if (core_data._8_8_ == 0) {
    bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x46);
    if (!bVar3) goto LAB_001efc15;
  }
  uVar2 = core_data._8_8_;
  sVar4 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>
                    ((Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)(core_data._8_8_ + 0x38),name);
  lVar6 = sVar4 * 0x28 + *(long *)(uVar2 + 0x38);
  if (core_data._8_8_ == 0) {
    bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x46);
    if (!bVar3) {
LAB_001efc15:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  if (lVar6 == *(long *)(core_data._8_8_ + 0x40)) {
    pCVar5 = (Context *)0x0;
  }
  else {
    pCVar5 = *(Context **)(lVar6 + 0x20);
  }
  return pCVar5;
}

Assistant:

Context* GetContext(const String& name)
{
	auto it = core_data->contexts.find(name);
	if (it == core_data->contexts.end())
		return nullptr;

	return it->second.get();
}